

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::EnumValueDescriptorProto::Serialize
          (EnumValueDescriptorProto *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  EnumValueDescriptorProto *this_local;
  
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendString(msg,1,&this->name_);
  }
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,2,this->number_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void EnumValueDescriptorProto::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 2: number
  if (_has_field_[2]) {
    msg->AppendVarInt(2, number_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}